

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack21_8(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  uVar1 = *(ulong *)in;
  auVar5 = vpmovsxbd_avx(ZEXT416(0x4010100));
  *out = (uint)uVar1 & 0x1fffff;
  uVar2 = *(ulong *)(in + 2);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar2;
  auVar9 = vpsllvd_avx2(auVar8,_DAT_00191190);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar1;
  auVar3 = vpermi2d_avx512vl(auVar5,auVar4,auVar8);
  auVar6._8_4_ = 0x1fffff;
  auVar6._0_8_ = 0x1fffff001fffff;
  auVar6._12_4_ = 0x1fffff;
  auVar5._8_8_ = 0x1ff000001ffffe;
  auVar5._0_8_ = 0x1ff000001ffffe;
  auVar4 = vpandq_avx512vl(auVar9,auVar5);
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_0019c950);
  auVar9 = vpinsrd_avx(auVar6,((uint)(uVar1 >> 0x20) & 0x3ff) << 0xb,0);
  auVar5 = vpand_avx(auVar3,auVar6);
  auVar9 = vpunpcklqdq_avx(auVar9,auVar4);
  auVar9 = vpor_avx(auVar3,auVar9);
  auVar9 = vpblendd_avx2(auVar9,auVar5,2);
  auVar5 = vpmovsxbd_avx(ZEXT416(0x401));
  *(undefined1 (*) [16])(out + 1) = auVar9;
  uVar1 = *(ulong *)(in + 4);
  out[5] = (uint)(uVar2 >> 0x29) & 0x1fffff;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar1;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar2;
  auVar5 = vpermi2d_avx512vl(auVar5,auVar9,auVar7);
  auVar9 = vpsrlvd_avx2(auVar5,_DAT_0019c960);
  auVar5 = vpsllvd_avx2(auVar7,_DAT_001911c0);
  auVar3._8_8_ = 0x1fe000001ffffc;
  auVar3._0_8_ = 0x1fe000001ffffc;
  auVar5 = vpternlogq_avx512vl(auVar5,auVar9,auVar3,0xec);
  *(long *)(out + 6) = auVar5._0_8_;
  return in + 6;
}

Assistant:

const uint32_t *__fastunpack21_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 21);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 10)) << (21 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 21);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 20)) << (21 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 9)) << (21 - 9);
  out++;
  *out = ((*in) >> 9) % (1U << 21);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 19)) << (21 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 8)) << (21 - 8);
  out++;

  return in + 1;
}